

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

void __thiscall amrex::BARef::define(BARef *this,Box *bx)

{
  pointer *ppBVar1;
  undefined8 *puVar2;
  pointer __p;
  pointer pBVar3;
  pointer pBVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  size_type __n;
  pointer pBVar8;
  pointer pBVar9;
  pointer pBVar10;
  pointer pBVar11;
  
  pBVar11 = (this->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pBVar11 !=
      (this->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    uVar5 = *(undefined8 *)(bx->smallend).vect;
    uVar6 = *(undefined8 *)((bx->smallend).vect + 2);
    uVar7 = *(undefined8 *)((bx->bigend).vect + 2);
    *(undefined8 *)(pBVar11->bigend).vect = *(undefined8 *)(bx->bigend).vect;
    *(undefined8 *)((pBVar11->bigend).vect + 2) = uVar7;
    *(undefined8 *)(pBVar11->smallend).vect = uVar5;
    *(undefined8 *)((pBVar11->smallend).vect + 2) = uVar6;
    ppBVar1 = &(this->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppBVar1 = *ppBVar1 + 1;
    return;
  }
  __n = std::vector<amrex::Box,_std::allocator<amrex::Box>_>::_M_check_len
                  ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)this,1,
                   "vector::_M_realloc_insert");
  __p = (this->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start;
  pBVar3 = (this->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pBVar8 = std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::_M_allocate
                     ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)this,__n);
  uVar5 = *(undefined8 *)((bx->smallend).vect + 2);
  uVar6 = *(undefined8 *)(bx->bigend).vect;
  uVar7 = *(undefined8 *)((bx->bigend).vect + 2);
  puVar2 = (undefined8 *)((long)pBVar8 + ((long)pBVar11 - (long)__p));
  *puVar2 = *(undefined8 *)(bx->smallend).vect;
  puVar2[1] = uVar5;
  puVar2 = (undefined8 *)((long)pBVar8 + ((long)pBVar11 - (long)__p) + 0xc);
  *puVar2 = uVar6;
  puVar2[1] = uVar7;
  pBVar4 = pBVar8;
  for (pBVar9 = __p; pBVar10 = pBVar4 + 1, pBVar9 != pBVar11; pBVar9 = pBVar9 + 1) {
    uVar5 = *(undefined8 *)(pBVar9->smallend).vect;
    uVar6 = *(undefined8 *)((pBVar9->smallend).vect + 2);
    uVar7 = *(undefined8 *)((pBVar9->bigend).vect + 2);
    *(undefined8 *)(pBVar4->bigend).vect = *(undefined8 *)(pBVar9->bigend).vect;
    *(undefined8 *)((pBVar4->bigend).vect + 2) = uVar7;
    *(undefined8 *)(pBVar4->smallend).vect = uVar5;
    *(undefined8 *)((pBVar4->smallend).vect + 2) = uVar6;
    pBVar4 = pBVar10;
  }
  for (; pBVar11 != pBVar3; pBVar11 = pBVar11 + 1) {
    uVar5 = *(undefined8 *)(pBVar11->smallend).vect;
    uVar6 = *(undefined8 *)((pBVar11->smallend).vect + 2);
    uVar7 = *(undefined8 *)((pBVar11->bigend).vect + 2);
    *(undefined8 *)(pBVar10->bigend).vect = *(undefined8 *)(pBVar11->bigend).vect;
    *(undefined8 *)((pBVar10->bigend).vect + 2) = uVar7;
    *(undefined8 *)(pBVar10->smallend).vect = uVar5;
    *(undefined8 *)((pBVar10->smallend).vect + 2) = uVar6;
    pBVar10 = pBVar10 + 1;
  }
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::_M_deallocate
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)this,__p,
             ((long)(this->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage - (long)__p) / 0x1c);
  (this->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = pBVar8;
  (this->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = pBVar10;
  (this->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pBVar8 + __n;
  return;
}

Assistant:

void
BARef::define (const Box& bx)
{
    BL_ASSERT(m_abox.size() == 0);
#ifdef AMREX_MEM_PROFILING
    updateMemoryUsage_box(-1);
#endif
    m_abox.push_back(bx);
#ifdef AMREX_MEM_PROFILING
    updateMemoryUsage_box(1);
#endif
}